

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_flush.c
# Opt level: O2

int mpt_stream_flush(mpt_stream *stream)

{
  mpt_encode_queue *pmVar1;
  size_t *psVar2;
  void *__addr;
  size_t sVar3;
  uint uVar4;
  int __fd;
  ulong uVar5;
  int __count;
  ulong uVar6;
  ulong __len;
  iovec io [2];
  
  uVar5 = (stream->_wd)._state.done;
  if (uVar5 != 0) {
    pmVar1 = &stream->_wd;
    uVar4 = mpt_stream_flags(&stream->_info);
    if ((uVar4 & 0x90) == 0x80) {
      __addr = (stream->_wd).data.base;
      sVar3 = (stream->_wd).data.off;
      uVar6 = (stream->_wd).data.max - sVar3;
      __len = uVar5;
      if (uVar6 <= uVar5 && uVar5 - uVar6 != 0) {
        msync(__addr,uVar5 - uVar6,1);
        __len = uVar6;
      }
      msync((void *)((long)__addr + sVar3),__len,1);
    }
    else {
      __fd = _mpt_stream_fwrite(&stream->_info);
      if (-1 < __fd) {
        io[0].iov_base = (void *)mpt_queue_data(pmVar1,&io[0].iov_len);
        if (io[0].iov_base == (void *)0x0) {
          return -2;
        }
        if (uVar5 < io[0].iov_len || uVar5 - io[0].iov_len == 0) {
          __count = 1;
          io[0].iov_len = uVar5;
        }
        else {
          __count = 2;
          io[1].iov_base = (pmVar1->data).base;
          io[1].iov_len = uVar5 - io[0].iov_len;
        }
        uVar5 = writev(__fd,(iovec *)io,__count);
        if (uVar5 == 0) {
          mpt_stream_seterror(&stream->_info,2);
          return 1;
        }
      }
    }
    mpt_queue_crop(pmVar1,0,uVar5);
    psVar2 = &(stream->_wd)._state.done;
    *psVar2 = *psVar2 - uVar5;
  }
  return (uint)((stream->_wd).data.len != 0);
}

Assistant:

extern int mpt_stream_flush(MPT_STRUCT(stream) *stream)
{
	size_t len;
	int file;
	
	/* write data */
	len = stream->_wd._state.done;
	if (!len) {
		return stream->_wd.data.len ? 1 : 0;
	}
	file = mpt_stream_flags(&stream->_info);
	
	/* update memory mapped file */
	if ((file & MPT_STREAMFLAG(WriteMap))
	    && !(file & MPT_STREAMFLAG(ReadBuf))) {
		uint8_t *base = stream->_wd.data.base;
		size_t off, low;
		
		off = stream->_wd.data.off;
		low = stream->_wd.data.max - off;
		if (len > low) {
			msync(base, len - low, MS_ASYNC);
		} else {
			low = len;
		}
		msync(base + off, low, MS_ASYNC);
	}
	/* try to save ready data to backing file */
	else if ((file = _mpt_stream_fwrite(&stream->_info)) >= 0) {
		struct iovec io[2];
		/* get used parts */
		if (!(io[0].iov_base = mpt_queue_data(&stream->_wd.data, &io[0].iov_len))) {
			return -2;
		}
		/* prepare upper data part */
		if (len > io[0].iov_len) {
			io[1].iov_base = stream->_wd.data.base;
			io[1].iov_len  = len = len - io[0].iov_len;
		} else {
			io[0].iov_len = len;
			len = 0;
		}
		/* write queue buffer data to file */
		if ((len = writev(file, io, len ? 2 : 1)) <= 0) {
			if (!len) {
				mpt_stream_seterror(&stream->_info, MPT_ENUM(ErrorFull));
				return 1;
			} else {
				mpt_stream_seterror(&stream->_info, MPT_ENUM(ErrorWrite));
			}
			return len;
		}
	}
	/* remove written data from queue */
	mpt_queue_crop(&stream->_wd.data, 0, len);
	stream->_wd._state.done -= len;
	
	/* remaining data */
	return stream->_wd.data.len ? 1 : 0;
}